

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::HandleTransitionProperty(Element *this)

{
  PropertyId PVar1;
  undefined8 uVar2;
  pointer pTVar3;
  pointer pTVar4;
  undefined8 uVar5;
  undefined3 uVar6;
  float fVar7;
  int iVar8;
  TransitionList *pTVar9;
  pointer pEVar10;
  long lVar11;
  iterator __last;
  pointer pEVar12;
  pointer pTVar13;
  pointer pTVar14;
  long lVar15;
  iterator iVar16;
  iterator __first;
  vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_> local_88;
  undefined5 uStack_70;
  undefined3 local_6b;
  undefined5 uStack_68;
  vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_> local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  float fStack_40;
  undefined4 uStack_3c;
  undefined3 uStack_38;
  
  if ((this->field_0x17 & 0x10) != 0) {
    this->field_0x17 = this->field_0x17 & 0xef;
    pTVar9 = Style::ComputedValues::transition(&this->meta->computed_values);
    if ((pTVar9 == (TransitionList *)0x0) || (pTVar9->all == false)) {
      if ((pTVar9 == (TransitionList *)0x0) || (pTVar9->none == true)) {
        __first._M_current =
             (this->animations).
             super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>.
             _M_impl.super__Vector_impl_data._M_start;
        pEVar12 = (this->animations).
                  super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (__first._M_current != pEVar12) {
          pEVar10 = __first._M_current;
          do {
            while (__first._M_current = pEVar10, (__first._M_current)->origin == Transition) {
              do {
                pEVar10 = pEVar12;
                pEVar12 = pEVar10 + -1;
                if (pEVar12 == __first._M_current) goto LAB_00217e61;
              } while (pEVar10[-1].origin == Transition);
              uVar2._0_1_ = (__first._M_current)->property_id;
              uVar2._1_3_ = *(undefined3 *)&(__first._M_current)->field_0x1;
              uVar2._4_4_ = (__first._M_current)->duration;
              uStack_68 = (undefined5)
                          ((ulong)*(undefined8 *)((long)&(__first._M_current)->duration + 1) >> 0x18
                          );
              uStack_70 = (undefined5)uVar2;
              local_6b = (undefined3)((uint)uVar2._4_4_ >> 8);
              local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   ((__first._M_current)->keys).
                   super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl
                   .super__Vector_impl_data._M_start;
              local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   ((__first._M_current)->keys).
                   super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl
                   .super__Vector_impl_data._M_finish;
              local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   ((__first._M_current)->keys).
                   super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
              ((__first._M_current)->keys).
              super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ((__first._M_current)->keys).
              super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              ((__first._M_current)->keys).
              super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              uStack_38 = (undefined3)
                          ((uint)*(undefined4 *)((long)&(__first._M_current)->current_iteration + 3)
                          >> 8);
              local_48 = *(undefined4 *)&(__first._M_current)->last_update_world_time;
              uStack_44 = *(undefined4 *)((long)&(__first._M_current)->last_update_world_time + 4);
              fStack_40 = (__first._M_current)->time_since_iteration_start;
              uStack_3c = (__first._M_current)->current_iteration;
              uVar6 = *(undefined3 *)&pEVar12->field_0x1;
              fVar7 = pEVar12->duration;
              uVar2 = *(undefined8 *)((long)&pEVar10[-1].duration + 1);
              (__first._M_current)->property_id = pEVar12->property_id;
              *(undefined3 *)&(__first._M_current)->field_0x1 = uVar6;
              (__first._M_current)->duration = fVar7;
              *(undefined8 *)((long)&(__first._M_current)->duration + 1) = uVar2;
              ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::_M_move_assign
                        (&(__first._M_current)->keys,&pEVar10[-1].keys);
              *(undefined4 *)((long)&(__first._M_current)->current_iteration + 3) =
                   *(undefined4 *)((long)&pEVar10[-1].current_iteration + 3);
              fVar7 = pEVar10[-1].time_since_iteration_start;
              iVar8 = pEVar10[-1].current_iteration;
              (__first._M_current)->last_update_world_time = pEVar10[-1].last_update_world_time;
              (__first._M_current)->time_since_iteration_start = fVar7;
              (__first._M_current)->current_iteration = iVar8;
              *(ulong *)((long)&pEVar10[-1].duration + 1) = CONCAT53(uStack_68,local_6b);
              pEVar12->property_id = (char)uStack_70;
              *(int3 *)&pEVar12->field_0x1 = (int3)((uint5)uStack_70 >> 8);
              pEVar12->duration = (float)(int)(CONCAT35(local_6b,uStack_70) >> 0x20);
              local_88.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   pEVar10[-1].keys.
                   super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl
                   .super__Vector_impl_data._M_start;
              local_88.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   pEVar10[-1].keys.
                   super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl
                   .super__Vector_impl_data._M_finish;
              local_88.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   pEVar10[-1].keys.
                   super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
              pEVar10[-1].keys.
              super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_60.
                   super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl
                   .super__Vector_impl_data._M_start;
              pEVar10[-1].keys.
              super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_60.
                   super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl
                   .super__Vector_impl_data._M_finish;
              pEVar10[-1].keys.
              super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_60.
                   super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
              local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector
                        (&local_88);
              *(uint *)((long)&pEVar10[-1].current_iteration + 3) =
                   CONCAT31(uStack_38,uStack_3c._3_1_);
              pEVar10[-1].last_update_world_time = (double)CONCAT44(uStack_44,local_48);
              pEVar10[-1].time_since_iteration_start = fStack_40;
              pEVar10[-1].current_iteration = uStack_3c;
              ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector
                        (&local_60);
              pEVar10 = __first._M_current + 1;
              if (pEVar12 == __first._M_current + 1) {
                __first._M_current = __first._M_current + 1;
                goto LAB_00217e61;
              }
            }
            __first._M_current = __first._M_current + 1;
            pEVar10 = __first._M_current;
          } while (__first._M_current != pEVar12);
        }
      }
      else {
        __first._M_current =
             (this->animations).
             super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>.
             _M_impl.super__Vector_impl_data._M_start;
        pEVar12 = (this->animations).
                  super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (__first._M_current != pEVar12) {
          do {
            if ((__first._M_current)->origin == Transition) {
              pTVar3 = (pTVar9->transitions).
                       super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl
                       .super__Vector_impl_data._M_start;
              pTVar4 = (pTVar9->transitions).
                       super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl
                       .super__Vector_impl_data._M_finish;
              lVar11 = ((long)pTVar4 - (long)pTVar3 >> 3) * -0x3333333333333333 >> 2;
              pTVar13 = pTVar3;
              if (0 < lVar11) {
                PVar1 = (__first._M_current)->property_id;
                pTVar13 = pTVar3 + lVar11 * 4;
                lVar15 = lVar11 + 1;
                pTVar14 = pTVar3 + 2;
                do {
                  if (PVar1 == pTVar14[-2].id) {
                    pTVar14 = pTVar14 + -2;
                    goto LAB_00217c5b;
                  }
                  if (PVar1 == pTVar14[-1].id) {
                    pTVar14 = pTVar14 + -1;
                    goto LAB_00217c5b;
                  }
                  if (PVar1 == pTVar14->id) goto LAB_00217c5b;
                  if (PVar1 == pTVar14[1].id) {
                    pTVar14 = pTVar14 + 1;
                    goto LAB_00217c5b;
                  }
                  lVar15 = lVar15 + -1;
                  pTVar14 = pTVar14 + 4;
                } while (1 < lVar15);
              }
              lVar15 = ((long)pTVar4 - (long)pTVar13 >> 3) * -0x3333333333333333;
              if (lVar15 == 1) {
LAB_00217c3c:
                pTVar14 = pTVar13;
                if ((__first._M_current)->property_id != pTVar13->id) {
                  pTVar14 = pTVar4;
                }
              }
              else if (lVar15 == 2) {
LAB_00217c30:
                pTVar14 = pTVar13;
                if ((__first._M_current)->property_id != pTVar13->id) {
                  pTVar13 = pTVar13 + 1;
                  goto LAB_00217c3c;
                }
              }
              else {
                pTVar14 = pTVar4;
                if ((lVar15 == 3) &&
                   (pTVar14 = pTVar13, (__first._M_current)->property_id != pTVar13->id)) {
                  pTVar13 = pTVar13 + 1;
                  goto LAB_00217c30;
                }
              }
LAB_00217c5b:
              if (pTVar14 == pTVar4) {
                do {
                  pEVar10 = pEVar12;
                  pEVar12 = pEVar10 + -1;
                  if (__first._M_current == pEVar12) goto LAB_00217e61;
                  if (pEVar10[-1].origin != Transition) break;
                  pTVar13 = pTVar3;
                  if (0 < lVar11) {
                    PVar1 = pEVar12->property_id;
                    pTVar14 = pTVar3 + 2;
                    lVar15 = lVar11 + 1;
                    do {
                      if (PVar1 == pTVar14[-2].id) {
                        pTVar14 = pTVar14 + -2;
                        goto LAB_00217d3a;
                      }
                      if (PVar1 == pTVar14[-1].id) {
                        pTVar14 = pTVar14 + -1;
                        goto LAB_00217d3a;
                      }
                      if (PVar1 == pTVar14->id) goto LAB_00217d3a;
                      if (PVar1 == pTVar14[1].id) {
                        pTVar14 = pTVar14 + 1;
                        goto LAB_00217d3a;
                      }
                      lVar15 = lVar15 + -1;
                      pTVar14 = pTVar14 + 4;
                      pTVar13 = pTVar3 + lVar11 * 4;
                    } while (1 < lVar15);
                  }
                  lVar15 = ((long)pTVar4 - (long)pTVar13 >> 3) * -0x3333333333333333;
                  if (lVar15 == 1) {
LAB_00217d1a:
                    pTVar14 = pTVar13;
                    if (pEVar12->property_id != pTVar13->id) {
                      pTVar14 = pTVar4;
                    }
                  }
                  else if (lVar15 == 2) {
LAB_00217d0d:
                    pTVar14 = pTVar13;
                    if (pEVar12->property_id != pTVar13->id) {
                      pTVar13 = pTVar13 + 1;
                      goto LAB_00217d1a;
                    }
                  }
                  else {
                    pTVar14 = pTVar4;
                    if ((lVar15 == 3) && (pTVar14 = pTVar13, pEVar12->property_id != pTVar13->id)) {
                      pTVar13 = pTVar13 + 1;
                      goto LAB_00217d0d;
                    }
                  }
LAB_00217d3a:
                } while (pTVar14 == pTVar4);
                uVar5._0_1_ = (__first._M_current)->property_id;
                uVar5._1_3_ = *(undefined3 *)&(__first._M_current)->field_0x1;
                uVar5._4_4_ = (__first._M_current)->duration;
                uStack_68 = (undefined5)
                            ((ulong)*(undefined8 *)((long)&(__first._M_current)->duration + 1) >>
                            0x18);
                uStack_70 = (undefined5)uVar5;
                local_6b = (undefined3)((uint)uVar5._4_4_ >> 8);
                local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     ((__first._M_current)->keys).
                     super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     ((__first._M_current)->keys).
                     super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     ((__first._M_current)->keys).
                     super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
                ((__first._M_current)->keys).
                super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ((__first._M_current)->keys).
                super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                ((__first._M_current)->keys).
                super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                uStack_38 = (undefined3)
                            ((uint)*(undefined4 *)
                                    ((long)&(__first._M_current)->current_iteration + 3) >> 8);
                local_48 = *(undefined4 *)&(__first._M_current)->last_update_world_time;
                uStack_44 = *(undefined4 *)((long)&(__first._M_current)->last_update_world_time + 4)
                ;
                fStack_40 = (__first._M_current)->time_since_iteration_start;
                uStack_3c = (__first._M_current)->current_iteration;
                uVar6 = *(undefined3 *)&pEVar12->field_0x1;
                fVar7 = pEVar12->duration;
                uVar2 = *(undefined8 *)((long)&pEVar10[-1].duration + 1);
                (__first._M_current)->property_id = pEVar12->property_id;
                *(undefined3 *)&(__first._M_current)->field_0x1 = uVar6;
                (__first._M_current)->duration = fVar7;
                *(undefined8 *)((long)&(__first._M_current)->duration + 1) = uVar2;
                ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::_M_move_assign
                          (&(__first._M_current)->keys,&pEVar10[-1].keys);
                *(undefined4 *)((long)&(__first._M_current)->current_iteration + 3) =
                     *(undefined4 *)((long)&pEVar10[-1].current_iteration + 3);
                fVar7 = pEVar10[-1].time_since_iteration_start;
                iVar8 = pEVar10[-1].current_iteration;
                (__first._M_current)->last_update_world_time = pEVar10[-1].last_update_world_time;
                (__first._M_current)->time_since_iteration_start = fVar7;
                (__first._M_current)->current_iteration = iVar8;
                *(ulong *)((long)&pEVar10[-1].duration + 1) = CONCAT53(uStack_68,local_6b);
                pEVar12->property_id = (char)uStack_70;
                *(int3 *)&pEVar12->field_0x1 = (int3)((uint5)uStack_70 >> 8);
                pEVar12->duration = (float)(int)(CONCAT35(local_6b,uStack_70) >> 0x20);
                local_88.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     pEVar10[-1].keys.
                     super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                local_88.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                _M_impl.super__Vector_impl_data._M_finish =
                     pEVar10[-1].keys.
                     super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                local_88.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     pEVar10[-1].keys.
                     super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
                pEVar10[-1].keys.
                super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_60.
                     super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                     _M_impl.super__Vector_impl_data._M_start;
                pEVar10[-1].keys.
                super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_60.
                     super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                pEVar10[-1].keys.
                super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_60.
                     super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
                local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_60.super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector
                          (&local_88);
                *(uint *)((long)&pEVar10[-1].current_iteration + 3) =
                     CONCAT31(uStack_38,uStack_3c._3_1_);
                pEVar10[-1].last_update_world_time = (double)CONCAT44(uStack_44,local_48);
                pEVar10[-1].time_since_iteration_start = fStack_40;
                pEVar10[-1].current_iteration = uStack_3c;
                ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::~vector
                          (&local_60);
              }
            }
            __first._M_current = __first._M_current + 1;
          } while (__first._M_current != pEVar12);
        }
      }
LAB_00217e61:
      __last._M_current =
           (this->animations).
           super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>._M_impl
           .super__Vector_impl_data._M_finish;
      iVar16._M_current = __first._M_current;
      if (__first._M_current != __last._M_current) {
        do {
          ElementStyle::RemoveProperty(&this->meta->style,(iVar16._M_current)->property_id);
          iVar16._M_current = iVar16._M_current + 1;
          __last._M_current =
               (this->animations).
               super__Vector_base<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>.
               _M_impl.super__Vector_impl_data._M_finish;
        } while (iVar16._M_current != __last._M_current);
      }
      ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::_M_erase
                (&this->animations,__first,__last);
    }
  }
  return;
}

Assistant:

void Element::HandleTransitionProperty()
{
	if (dirty_transition)
	{
		dirty_transition = false;

		// Remove all transitions that are no longer in our local list
		const TransitionList* keep_transitions = GetComputedValues().transition();

		if (keep_transitions && keep_transitions->all)
			return;

		auto it_remove = animations.end();

		if (!keep_transitions || keep_transitions->none)
		{
			// All transitions should be removed, but only touch the animations that originate from the 'transition' property.
			// Move all animations to be erased in a valid state at the end of the list, and erase later.
			it_remove = std::partition(animations.begin(), animations.end(),
				[](const ElementAnimation& animation) -> bool { return !animation.IsTransition(); });
		}
		else
		{
			RMLUI_ASSERT(keep_transitions);

			// Only remove the transitions that are not in our keep list.
			const auto& keep_transitions_list = keep_transitions->transitions;

			it_remove = std::partition(animations.begin(), animations.end(), [&keep_transitions_list](const ElementAnimation& animation) -> bool {
				if (!animation.IsTransition())
					return true;
				auto it = std::find_if(keep_transitions_list.begin(), keep_transitions_list.end(),
					[&animation](const Transition& transition) { return animation.GetPropertyId() == transition.id; });
				bool keep_animation = (it != keep_transitions_list.end());
				return keep_animation;
			});
		}

		// We can decide what to do with cancelled transitions here.
		for (auto it = it_remove; it != animations.end(); ++it)
			RemoveProperty(it->GetPropertyId());

		animations.erase(it_remove, animations.end());
	}
}